

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTagNS(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *pXVar1;
  short *psVar2;
  short *psVar3;
  char cVar4;
  XMLCh XVar5;
  XMLSize_t XVar6;
  Grammar *pGVar7;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar8;
  XMLValidator *pXVar9;
  XMLReader *this_01;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_02;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_03;
  RefHashTableBucketElem<unsigned_int> *pRVar10;
  XMLDocumentHandler *pXVar11;
  bool bVar12;
  XMLCh XVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_var;
  DTDElementDecl *this_04;
  DTDAttDef *pDVar16;
  XMLAttr *this_05;
  long lVar17;
  uint *puVar18;
  XMLCh *pXVar19;
  XMLSize_t XVar20;
  undefined4 extraout_var_00;
  XMLCh *pXVar21;
  UnexpectedEOFException *this_06;
  long lVar22;
  RefVectorOf<xercesc_4_0::XMLAttr> *theAttrList;
  XMLCh *pXVar23;
  ulong uVar24;
  AttTypes AVar25;
  byte bVar26;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar27;
  int colonPosition;
  XMLAttr *local_80;
  bool *local_78;
  XMLCh *local_70;
  DTDAttDef *local_68;
  XMLSize_t local_60;
  ElemStack *local_58;
  bool *local_50;
  XMLSize_t local_48;
  XMLBuffer *local_40;
  XMLSize_t failure;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar1 = &(this->super_XMLScanner).fQNameBuf;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar12 = XMLReader::getQName((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar1,&colonPosition)
  ;
  if (!bVar12) {
    XVar6 = pXVar1->fIndex;
    if (XVar6 == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar21 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar21[XVar6] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar13 = ReaderMgr::getNextChar(this_00);
      if (XVar13 == L'\0') {
        return false;
      }
    } while (XVar13 != L'<');
    return false;
  }
  XVar6 = (this->super_XMLScanner).fElemStack.fStackTop;
  pXVar21 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar21[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar7 = (this->super_XMLScanner).fGrammar;
  iVar14 = (*(pGVar7->super_XSerializable)._vptr_XSerializable[0xb])
                     (pGVar7,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  this_04 = (DTDElementDecl *)CONCAT44(extraout_var,iVar14);
  if (this_04 == (DTDElementDecl *)0x0) {
    pNVar8 = this->fDTDElemNonDeclPool;
    if (pNVar8->fIdCounter != 0) {
      uVar24 = (ulong)(ushort)*pXVar21;
      if (uVar24 == 0) {
        uVar24 = 0;
      }
      else {
        XVar13 = pXVar21[1];
        if (XVar13 != L'\0') {
          pXVar19 = pXVar21 + 2;
          do {
            uVar24 = (ulong)(ushort)XVar13 + (uVar24 >> 0x18) + uVar24 * 0x26;
            XVar13 = *pXVar19;
            pXVar19 = pXVar19 + 1;
          } while (XVar13 != L'\0');
        }
        uVar24 = uVar24 % (pNVar8->fBucketList).fHashModulus;
      }
      pRVar27 = (pNVar8->fBucketList).fBucketList[uVar24];
      if (pRVar27 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar12 = StringHasher::equals
                             ((StringHasher *)&(pNVar8->fBucketList).field_0x30,pXVar21,
                              pRVar27->fKey);
          if (bVar12) {
            this_04 = pRVar27->fData;
            if (this_04 != (DTDElementDecl *)0x0) {
              cVar4 = (this->super_XMLScanner).fValidate;
              goto joined_r0x002958b7;
            }
            break;
          }
          pRVar27 = pRVar27->fNext;
        } while (pRVar27 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
    }
    this_04 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_04,pXVar21,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar20 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_04);
    (this_04->super_XMLElementDecl).fId = XVar20;
    local_78 = &(this->super_XMLScanner).fValidate;
    if ((this->super_XMLScanner).fValidate != false) {
      (this_04->super_XMLElementDecl).fCreateReason = JustFaultIn;
LAB_00295924:
      local_78 = &(this->super_XMLScanner).fValidate;
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,ElementNotDefined,pXVar21,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00295940;
    }
  }
  else {
    cVar4 = (this->super_XMLScanner).fValidate;
joined_r0x002958b7:
    local_78 = &(this->super_XMLScanner).fValidate;
    if (cVar4 != '\0') {
      local_78 = &(this->super_XMLScanner).fValidate;
      if ((this_04->super_XMLElementDecl).fCreateReason != Declared) goto LAB_00295924;
LAB_00295940:
      pXVar9 = (this->super_XMLScanner).fValidator;
      (*pXVar9->_vptr_XMLValidator[9])(pXVar9,this_04);
    }
  }
  local_58 = &(this->super_XMLScanner).fElemStack;
  ElemStack::addLevel(local_58,&this_04->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  if (XVar6 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar19 = (this->super_XMLScanner).fRootElemName,
       pXVar21 != pXVar19 && pXVar19 != (XMLCh *)0x0)) {
      pXVar23 = pXVar21;
      if (pXVar21 == (XMLCh *)0x0) {
LAB_002959e8:
        if (*pXVar19 == L'\0') goto LAB_002959ff;
      }
      else {
        do {
          XVar13 = *pXVar23;
          if (XVar13 == L'\0') goto LAB_002959e8;
          pXVar23 = pXVar23 + 1;
          XVar5 = *pXVar19;
          pXVar19 = pXVar19 + 1;
        } while (XVar13 == XVar5);
      }
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  else if (*local_78 == true) {
    ElemStack::addChild(local_58,(this_04->super_XMLElementDecl).fElementName,true);
  }
LAB_002959ff:
  local_60 = XVar6;
  local_50 = gotData;
  ReaderMgr::skipPastSpaces(this_00);
  local_48 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
             fCurCount;
  this->fElemCount = this->fElemCount + 1;
  pXVar1 = &(this->super_XMLScanner).fAttNameBuf;
  local_40 = &(this->super_XMLScanner).fAttValueBuf;
  uVar24 = 0;
LAB_00295a45:
  while( true ) {
    XVar13 = ReaderMgr::peekNextChar(this_00);
    if (((uVar24 != 0) && (XVar13 != L'/')) && (XVar13 != L'>')) {
      if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar13] <
          '\0') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar13 = ReaderMgr::peekNextChar(this_00);
      }
      else {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
    }
    this_01 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    if ((this_01->fgCharCharsTable[(ushort)XVar13] & 0x10) == 0) break;
    if ((ushort)XVar13 < 0x27) {
      if (XVar13 == L'\"') {
LAB_00295b3e:
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(this_00);
        ReaderMgr::skipQuotedString(this_00,XVar13);
        ReaderMgr::skipPastSpaces(this_00);
      }
      else if (XVar13 == L'\0') {
        this_06 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (this_06,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0x745,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(this_06,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
    }
    else if ((ushort)XVar13 < 0x2f) {
      if (XVar13 == L'\'') goto LAB_00295b3e;
    }
    else {
      if (XVar13 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar12 = ReaderMgr::skippedChar(this_00,L'>');
        bVar26 = 1;
        if (!bVar12) {
          pXVar19 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
LAB_00295fd6:
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar19,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        goto LAB_00295ffb;
      }
      if (XVar13 == L'<') {
        pXVar19 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
        bVar26 = 0;
        goto LAB_00295fd6;
      }
      if (XVar13 == L'>') {
        ReaderMgr::getNextChar(this_00);
        bVar26 = 0;
LAB_00295ffb:
        theAttrList = (this->super_XMLScanner).fAttrList;
        if (uVar24 == 0) {
          uVar24 = 0;
        }
        else {
          scanAttrListforNameSpaces(this,theAttrList,uVar24,&this_04->super_XMLElementDecl);
          Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
          theAttrList = (this->super_XMLScanner).fAttrList;
        }
        XVar20 = buildAttList(this,uVar24,&this_04->super_XMLElementDecl,theAttrList);
        XVar6 = local_60;
        if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
          bVar12 = local_60 == 0;
          uVar15 = XMLScanner::resolvePrefix
                             (&this->super_XMLScanner,
                              ((this_04->super_XMLElementDecl).fElementName)->fPrefix,Mode_Element);
          pXVar11 = (this->super_XMLScanner).fDocHandler;
          (*pXVar11->_vptr_XMLDocumentHandler[0xb])
                    (pXVar11,this_04,(ulong)uVar15,
                     ((this_04->super_XMLElementDecl).fElementName)->fPrefix,
                     (this->super_XMLScanner).fAttrList,XVar20,(ulong)bVar26,(ulong)bVar12);
        }
        if (bVar26 != 0) {
          if ((*local_78 == true) &&
             (pXVar9 = (this->super_XMLScanner).fValidator,
             iVar14 = (*pXVar9->_vptr_XMLValidator[2])(pXVar9,this_04,0,0), (char)iVar14 == '\0')) {
            pXVar9 = (this->super_XMLScanner).fValidator;
            iVar14 = (*(this_04->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                               (this_04);
            XMLValidator::emitError
                      (pXVar9,ElementNotValidForContent,pXVar21,
                       (XMLCh *)CONCAT44(extraout_var_00,iVar14),(XMLCh *)0x0,(XMLCh *)0x0);
          }
          ElemStack::popTop(local_58);
          if (XVar6 == 0) {
            *local_50 = false;
            return true;
          }
          return true;
        }
        return true;
      }
    }
  }
  pXVar1->fIndex = 0;
  bVar12 = XMLReader::getQName(this_01,pXVar1,&colonPosition);
  if (!bVar12) {
    if (pXVar1->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
    }
    else {
      pXVar21 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
      pXVar21[pXVar1->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidAttrName,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar13 = ReaderMgr::getNextChar(this_00);
      if (XVar13 == L'\0') {
        return false;
      }
    } while (XVar13 != L'>');
    return false;
  }
  bVar12 = XMLScanner::scanEq(&this->super_XMLScanner,false);
  if (!bVar12) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
    XVar13 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
    if ((ushort)XVar13 < 0x3e) {
      if (XVar13 == L'/') goto LAB_00295a45;
      if ((XVar13 == L'\"') || (XVar13 == L'\'')) goto LAB_00295b8c;
    }
    else if (XVar13 == L'>') goto LAB_00295a45;
    if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)XVar13]) goto LAB_00296130;
  }
LAB_00295b8c:
  pXVar19 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
  pXVar19[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
  pDVar16 = DTDElementDecl::getAttDef(this_04,pXVar19);
  ReaderMgr::skipPastSpaces(this_00);
  local_68 = pDVar16;
  bVar12 = scanAttValue(this,&pDVar16->super_XMLAttDef,pXVar19,local_40);
  if (!bVar12) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
    XVar13 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
    if (((XVar13 != L'/') && (XVar13 != L'>')) &&
       (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)XVar13])) {
LAB_00296130:
      if (XVar13 != L'<') {
        return false;
      }
      pXVar21 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return false;
    }
  }
  local_70 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
  local_70[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
  local_80 = (XMLAttr *)pXVar19;
  if (uVar24 < local_48) {
    this_05 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,uVar24);
  }
  else {
    this_05 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
    XMLAttr::XMLAttr(this_05,(this->super_XMLScanner).fMemoryManager);
    this_02 = &((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
    BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_02,1);
    XVar6 = this_02->fCurCount;
    this_02->fElemList[XVar6] = this_05;
    this_02->fCurCount = XVar6 + 1;
  }
  this_05->fSpecified = true;
  if (local_68 == (DTDAttDef *)0x0) {
    AVar25 = AttTypes_Min;
  }
  else {
    AVar25 = (local_68->super_XMLAttDef).fType;
  }
  QName::setName(this_05->fAttName,(XMLCh *)local_80,(this->super_XMLScanner).fEmptyNamespaceId);
  XMLAttr::setValue(this_05,L"");
  this_05->fType = AVar25;
  pXVar19 = this_05->fAttName->fPrefix;
  pXVar23 = this_05->fAttName->fLocalPart;
  local_80 = this_05;
  if ((pXVar19 == (XMLCh *)0x0) || (XVar13 = *pXVar19, XVar13 == L'\0')) {
    if (pXVar23 == L"xmlns") {
LAB_00295dcc:
      pXVar23 = L"";
LAB_00295e27:
      updateNSMap(this,pXVar19,pXVar23,local_70);
    }
    else if (pXVar23 != (XMLCh *)0x0) {
      lVar17 = 0;
      do {
        psVar2 = (short *)((long)&XMLUni::fgXMLNSString + lVar17);
        if (*psVar2 == 0) {
          if (*(short *)((long)pXVar23 + lVar17) == 0) goto LAB_00295dcc;
          break;
        }
        psVar3 = (short *)((long)pXVar23 + lVar17);
        lVar17 = lVar17 + 2;
      } while (*psVar2 == *psVar3);
    }
  }
  else {
    if (pXVar19 != L"xml") {
      lVar17 = 0;
      do {
        lVar22 = lVar17;
        if (XVar13 != *(XMLCh *)((long)&XMLUni::fgXMLString + lVar22)) goto LAB_00295d58;
        XVar13 = *(XMLCh *)((long)pXVar19 + lVar22 + 2);
        lVar17 = lVar22 + 2;
      } while (XVar13 != L'\0');
      if (*(short *)((long)&DAT_0035b80c + lVar22) != 0) {
LAB_00295d58:
        if (pXVar19 == L"xmlns") {
LAB_00295e11:
          XMLAttr::setURIId(this_05,(this->super_XMLScanner).fXMLNSNamespaceId);
          goto LAB_00295e27;
        }
        lVar17 = 0;
        do {
          psVar2 = (short *)((long)pXVar19 + lVar17);
          if (*psVar2 == 0) {
            if (*(short *)((long)&XMLUni::fgXMLNSString + lVar17) == 0) goto LAB_00295e11;
            break;
          }
          psVar3 = (short *)((long)&XMLUni::fgXMLNSString + lVar17);
          lVar17 = lVar17 + 2;
        } while (*psVar2 == *psVar3);
        this_03 = this->fAttrNSList;
        ValueVectorOf<xercesc_4_0::XMLAttr_*>::ensureExtraCapacity(this_03,1);
        XVar6 = this_03->fCurCount;
        this_03->fCurCount = XVar6 + 1;
        this_03->fElemList[XVar6] = local_80;
        goto LAB_00295e31;
      }
    }
    XMLAttr::setURIId(this_05,(this->super_XMLScanner).fXMLNamespaceId);
  }
LAB_00295e31:
  pDVar16 = local_68;
  if (local_68 == (DTDAttDef *)0x0) {
    if (*local_78 != false) {
      pXVar19 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
      pXVar9 = (this->super_XMLScanner).fValidator;
      pXVar19[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
      XMLValidator::emitError
                (pXVar9,AttNotDefinedForElement,pXVar19,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  else {
    for (pRVar10 = this->fAttDefRegistry->fBucketList
                   [(ulong)local_68 % this->fAttDefRegistry->fHashModulus];
        pRVar10 != (RefHashTableBucketElem<unsigned_int> *)0x0; pRVar10 = pRVar10->fNext) {
      if ((DTDAttDef *)pRVar10->fKey == local_68) {
        puVar18 = pRVar10->fData;
        if (puVar18 != (uint *)0x0) {
          if (*puVar18 < this->fElemCount) {
            *puVar18 = this->fElemCount;
          }
          goto LAB_00295eeb;
        }
        break;
      }
    }
    puVar18 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
    *puVar18 = this->fElemCount;
    RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put(this->fAttDefRegistry,pDVar16,puVar18)
    ;
LAB_00295eeb:
    if (*local_78 != false) {
      pXVar9 = (this->super_XMLScanner).fValidator;
      (this->super_XMLScanner).fAttValueBuf.fBuffer[(this->super_XMLScanner).fAttValueBuf.fIndex] =
           L'\0';
      (*pXVar9->_vptr_XMLValidator[8])(pXVar9,local_68);
    }
  }
  XMLAttr::setValue(local_80,local_70);
  uVar24 = uVar24 + 1;
  goto LAB_00295a45;
}

Assistant:

bool DGXMLScanner::scanStartTagNS(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    int  colonPosition;
    bool validName = fReaderMgr.getQName(fQNameBuf, &colonPosition);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getQName(fAttNameBuf, &colonPosition);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);
            // DO NAMESPACES
            {
                curAtt->set(
                    fEmptyNamespaceId, namePtr, XMLUni::fgZeroLenString
                    , (attDef)? attDef->getType() : XMLAttDef::CData
                );

                // each attribute has the prefix:suffix="value"
                const XMLCh* attPrefix = curAtt->getPrefix();
                const XMLCh* attLocalName = curAtt->getName();

                if (attPrefix && *attPrefix) {
                    if (XMLString::equals(attPrefix, XMLUni::fgXMLString)) {
                        curAtt->setURIId(fXMLNamespaceId);
                    }
                    else if (XMLString::equals(attPrefix, XMLUni::fgXMLNSString)) {
                        curAtt->setURIId(fXMLNSNamespaceId);
                        updateNSMap(attPrefix, attLocalName, attrValue);
                    }
                    else {
                        fAttrNSList->addElement(curAtt);
                    }
                }
                else if (XMLString::equals(XMLUni::fgXMLNSString, attLocalName))
                {
                    updateNSMap(attPrefix, XMLUni::fgZeroLenString, attrValue);
                }

                // NOTE: duplicate attribute check will be done, when we map
                //       namespaces to all attributes
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                   }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  Make an initial pass through the list and find any xmlns attributes.
    if (attCount)
      scanAttrListforNameSpaces(fAttrList, attCount, elemDecl);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        unsigned int uriId = resolvePrefix
            (
                elemDecl->getElementName()->getPrefix()
                , ElemStack::Mode_Element
            );

        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , elemDecl->getElementName()->getPrefix()
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}